

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int fits_copy_pixlist2image
              (fitsfile *infptr,fitsfile *outfptr,int firstkey,int naxis,int *colnum,int *status)

{
  char *local_768;
  char *patterns [99] [2];
  int local_130;
  int lret;
  int mret;
  int nret;
  int jret;
  int iret;
  int npat;
  int pat_num;
  char outrec [81];
  char local_b8 [8];
  char rec [81];
  int nmore;
  int nkeys;
  int nrec;
  int *status_local;
  int *colnum_local;
  int naxis_local;
  int firstkey_local;
  fitsfile *outfptr_local;
  fitsfile *infptr_local;
  
  iret = 0;
  memcpy(&local_768,&PTR_anon_var_dwarf_2bff4_002b6f50,0x630);
  if (*status < 1) {
    jret = 99;
    ffghsp(infptr,(int *)(rec + 0x50),(int *)(rec + 0x4c),status);
    for (nmore = firstkey; nmore <= stack0xffffffffffffffa0; nmore = nmore + 1) {
      npat._0_1_ = '\0';
      ffgrec(infptr,nmore,local_b8,status);
      fits_translate_pixkeyword
                (local_b8,(char *)&npat,(char *(*) [2])&local_768,jret,naxis,colnum,&iret,&nret,
                 &mret,&lret,&local_130,(int *)((long)patterns[0x62] + 0xc),status);
      if ((char)npat != '\0') {
        ffprec(outfptr,(char *)&npat,status);
      }
      rec[0] = '\0';
      outrec[0] = '\0';
    }
    infptr_local._4_4_ = *status;
  }
  else {
    infptr_local._4_4_ = *status;
  }
  return infptr_local._4_4_;
}

Assistant:

int fits_copy_pixlist2image(
	   fitsfile *infptr,   /* I - pointer to input HDU */
	   fitsfile *outfptr,  /* I - pointer to output HDU */
	   int firstkey,       /* I - first HDU record number to start with */
           int naxis,          /* I - number of axes in the image */
           int *colnum,       /* I - numbers of the columns to be binned  */
           int *status)        /* IO - error status */
/*
     Copy relevant keywords from the pixel list table header into a newly
     created primary array header.  Convert names of keywords where
     appropriate.  See fits_translate_pixkeyword() for the definitions.

     Translation begins at header record number 'firstkey', and
     continues to the end of the header.
*/
{
    int nrec, nkeys, nmore;
    char rec[FLEN_CARD], outrec[FLEN_CARD];
    int pat_num = 0, npat;
    int iret, jret, nret, mret, lret;
    char *patterns[][2] = {

			   {"TCTYPn",  "CTYPEn"    },
			   {"TCTYna",  "CTYPEna"   },
			   {"TCUNIn",  "CUNITn"    },
			   {"TCUNna",  "CUNITna"   },
			   {"TCRVLn",  "CRVALn"    },
			   {"TCRVna",  "CRVALna"   },
			   {"TCDLTn",  "CDELTn"    },
			   {"TCDEna",  "CDELTna"   },
			   {"TCRPXn",  "CRPIXn"    },
			   {"TCRPna",  "CRPIXna"   },
			   {"TCROTn",  "CROTAn"    },
			   {"TPn_ma",  "PCn_ma"    },
			   {"TPCn_m",  "PCn_ma"    },
			   {"TCn_ma",  "CDn_ma"    },
			   {"TCDn_m",  "CDn_ma"    },
			   {"TVn_la",  "PVn_la"    },
			   {"TPVn_l",  "PVn_la"    },
			   {"TSn_la",  "PSn_la"    },
			   {"TPSn_l",  "PSn_la"    },
			   {"TWCSna",  "WCSNAMEa"  },
			   {"TCNAna",  "CNAMEna"   },
			   {"TCRDna",  "CRDERna"   },
			   {"TCSYna",  "CSYERna"   },
			   {"LONPna",  "LONPOLEa"  },
			   {"LATPna",  "LATPOLEa"  },
			   {"EQUIna",  "EQUINOXa"  },
			   {"MJDOBn",  "MJD-OBS"   },
			   {"MJDAn",   "MJD-AVG"   },
			   {"DAVGn",   "DATE-AVG"  },
			   {"RADEna",  "RADESYSa"  },
			   {"RFRQna",  "RESTFRQa"  },
			   {"RWAVna",  "RESTWAVa"  },
			   {"SPECna",  "SPECSYSa"  },
			   {"SOBSna",  "SSYSOBSa"  },
			   {"SSRCna",  "SSYSSRCa"  },

                           /* preserve common keywords */
			   {"LONPOLEa",   "+"       },
			   {"LATPOLEa",   "+"       },
			   {"EQUINOXa",   "+"       },
			   {"EPOCH",      "+"       },
			   {"MJD-????",   "+"       },
			   {"DATE????",   "+"       },
			   {"TIME????",   "+"       },
			   {"RADESYSa",   "+"       },
			   {"RADECSYS",   "+"       },
			   {"TELESCOP",   "+"       },
			   {"INSTRUME",   "+"       },
			   {"OBSERVER",   "+"       },
			   {"OBJECT",     "+"       },

                           /* Delete general table column keywords */
			   {"XTENSION", "-"       },
			   {"BITPIX",   "-"       },
			   {"NAXIS",    "-"       },
			   {"NAXISi",   "-"       },
			   {"PCOUNT",   "-"       },
			   {"GCOUNT",   "-"       },
			   {"TFIELDS",  "-"       },

			   {"TDIM#",   "-"       },
			   {"THEAP",   "-"       },
			   {"EXTNAME", "-"       }, 
			   {"EXTVER",  "-"       },
			   {"EXTLEVEL","-"       },
			   {"CHECKSUM","-"       },
			   {"DATASUM", "-"       },
			   {"NAXLEN",  "-"       },
			   {"AXLEN#",  "-"       },
			   {"CPREF",  "-"       },
			   
                           /* Delete table keywords related to other columns */
			   {"T????#a", "-"       }, 
 			   {"TC??#a",  "-"       },
 			   {"T??#_#",  "-"       },
 			   {"TWCS#a",  "-"       },

			   {"LONP#a",  "-"       },
			   {"LATP#a",  "-"       },
			   {"EQUI#a",  "-"       },
			   {"MJDOB#",  "-"       },
			   {"MJDA#",   "-"       },
			   {"RADE#a",  "-"       },
			   {"DAVG#",   "-"       },

			   {"iCTYP#",  "-"       },
			   {"iCTY#a",  "-"       },
			   {"iCUNI#",  "-"       },
			   {"iCUN#a",  "-"       },
			   {"iCRVL#",  "-"       },
			   {"iCDLT#",  "-"       },
			   {"iCRPX#",  "-"       },
			   {"iCTY#a",  "-"       },
			   {"iCUN#a",  "-"       },
			   {"iCRV#a",  "-"       },
			   {"iCDE#a",  "-"       },
			   {"iCRP#a",  "-"       },
			   {"ijPC#a",  "-"       },
			   {"ijCD#a",  "-"       },
			   {"iV#_#a",  "-"       },
			   {"iS#_#a",  "-"       },
			   {"iCRD#a",  "-"       },
			   {"iCSY#a",  "-"       },
			   {"iCROT#",  "-"       },
			   {"WCAX#a",  "-"       },
			   {"WCSN#a",  "-"       },
			   {"iCNA#a",  "-"       },

			   {"*",       "+"       }}; /* copy all other keywords */

    if (*status > 0)
        return(*status);

    npat = sizeof(patterns)/sizeof(patterns[0][0])/2;

    ffghsp(infptr, &nkeys, &nmore, status);  /* get number of keywords */

    for (nrec = firstkey; nrec <= nkeys; nrec++) {
      outrec[0] = '\0';

      ffgrec(infptr, nrec, rec, status);

      fits_translate_pixkeyword(rec, outrec, patterns, npat, 
			     naxis, colnum, 
			     &pat_num, &iret, &jret, &nret, &mret, &lret, status);

      if (outrec[0]) {
	ffprec(outfptr, outrec, status); /* copy the keyword */
      } 

      rec[8] = 0; outrec[8] = 0;
    }	

    return(*status);
}